

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::ConstraintsGroup::evaluateConstraints
          (ConstraintsGroup *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *constraints)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  element_type *peVar3;
  long *plVar4;
  bool bVar5;
  char cVar6;
  ulong uVar7;
  ostream *poVar8;
  size_t sVar9;
  long lVar10;
  reverse_iterator constraintIterator;
  ostringstream errorMsg;
  undefined1 local_1e8 [16];
  __node_base local_1d8;
  pointer puStack_1d0;
  undefined1 local_1c8;
  pointer local_1b8;
  pointer psStack_1b0;
  undefined1 local_1a8;
  undefined1 local_1a0 [32];
  pointer psStack_180;
  undefined1 local_178;
  variable_if_dynamic<long,__1> local_170;
  pointer local_160;
  
  local_1e8._8_8_ = time;
  bVar5 = isAnyTimeGroup(this);
  if (bVar5) {
    p_Var2 = ((this->m_pimpl->group)._M_h._M_before_begin._M_nxt[5]._M_nxt)->_M_nxt;
    cVar6 = (*(code *)p_Var2->_M_nxt[3]._M_nxt)
                      ((int)local_1e8._8_8_,p_Var2,state,control,constraints);
    if (cVar6 != '\0') {
      uVar7 = iDynTree::VectorDynSize::size();
      if (uVar7 <= this->m_pimpl->maxConstraintSize) {
        return true;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      poVar8 = std::operator<<((ostream *)local_1a0,"Constraint named ");
      poVar8 = std::operator<<(poVar8,(string *)
                                      ((this->m_pimpl->group)._M_h._M_before_begin._M_nxt + 1));
      std::operator<<(poVar8,"output a vector bigger than the specified size.");
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("ConstraintsGroup","evaluateConstraints",(char *)local_1d8._M_nxt);
LAB_001aaa24:
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    }
LAB_001aaa38:
    bVar5 = false;
  }
  else {
    uVar7 = iDynTree::VectorDynSize::size();
    if (uVar7 < this->m_pimpl->maxConstraintSize) {
      iDynTree::VectorDynSize::resize((ulong)constraints);
    }
    ConstraintsGroupPimpl::findActiveConstraint
              ((ConstraintsGroupPimpl *)local_1e8,(double)local_1e8._8_8_);
    if ((pointer)local_1e8._0_8_ ==
        (this->m_pimpl->orderedIntervals).
        super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      iDynTree::VectorDynSize::zero();
    }
    else {
      peVar3 = (((pointer)(local_1e8._0_8_ + -0x10))->
               super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      plVar4 = *(long **)&peVar3->constraint;
      cVar6 = (**(code **)(*plVar4 + 0x18))
                        ((int)local_1e8._8_8_,plVar4,state,control,&peVar3->constraintBuffer);
      if (cVar6 == '\0') goto LAB_001aaa38;
      uVar7 = iDynTree::VectorDynSize::size();
      if (this->m_pimpl->maxConstraintSize < uVar7) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        poVar8 = std::operator<<((ostream *)local_1a0,"Constraint named ");
        poVar8 = std::operator<<(poVar8,(string *)
                                        ((this->m_pimpl->group)._M_h._M_before_begin._M_nxt + 1));
        std::operator<<(poVar8,"output a vector bigger than the specified size.");
        std::__cxx11::stringbuf::str();
        iDynTree::reportError("ConstraintsGroup","evaluateConstraints",(char *)local_1d8._M_nxt);
        goto LAB_001aaa24;
      }
      sVar9 = Constraint::constraintSize
                        (*(Constraint **)
                          &((((pointer)(local_1e8._0_8_ + -0x10))->
                            super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->constraint);
      if (sVar9 < this->m_pimpl->maxConstraintSize) {
        toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1d8,
                &((((pointer)(local_1e8._0_8_ + -0x10))->
                  super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->constraintBuffer);
        toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1b8,
                constraints);
        local_1a0._8_8_ = iDynTree::VectorDynSize::size();
        local_1a0._0_8_ = local_1b8;
        local_1a0._24_8_ = local_1b8;
        psStack_180 = psStack_1b0;
        local_178 = local_1a8;
        local_170.m_value = 0;
        local_160 = psStack_1b0;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
                  ((Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>
                    *)local_1a0,
                   (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                   &local_1d8);
        toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1d8,
                constraints);
        uVar1 = this->m_pimpl->maxConstraintSize;
        lVar10 = iDynTree::VectorDynSize::size();
        local_1a0._8_8_ = (ulong)uVar1 - lVar10;
        local_170.m_value = (long)puStack_1d0 - local_1a0._8_8_;
        local_1a0._0_8_ = local_1d8._M_nxt + local_170.m_value;
        local_1a0._24_8_ = local_1d8._M_nxt;
        psStack_180 = (pointer)puStack_1d0;
        local_178 = local_1c8;
        local_160 = (pointer)puStack_1d0;
        Eigen::
        DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_-1,_1,_false>_>
        ::setZero((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>
                   *)local_1a0);
      }
      else {
        iDynTree::VectorDynSize::operator=
                  (constraints,
                   &((((pointer)(local_1e8._0_8_ + -0x10))->
                     super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->constraintBuffer);
      }
    }
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool ConstraintsGroup::evaluateConstraints(double time, const VectorDynSize &state, const VectorDynSize &control, VectorDynSize &constraints)
        {
            if (isAnyTimeGroup()) {
                if (!(m_pimpl->group.begin()->second.get()->constraint->evaluateConstraint(time, state, control, constraints))) {
                    return false;
                }
                if (constraints.size() > m_pimpl->maxConstraintSize) {
                    std::ostringstream errorMsg;
                    errorMsg << "Constraint named "<<m_pimpl->group.begin()->first<< "output a vector bigger than the specified size.";
                    reportError("ConstraintsGroup", "evaluateConstraints", errorMsg.str().c_str());
                    return false;
                }
                return true;
            }

            if (constraints.size() < m_pimpl->maxConstraintSize) {
                constraints.resize(m_pimpl->maxConstraintSize);
            }

            std::vector< TimedConstraint_ptr >::reverse_iterator constraintIterator = m_pimpl->findActiveConstraint(time);
            if (constraintIterator == m_pimpl->orderedIntervals.rend()) { //it means that there are no constraints at that time, what should be the constraint value?
                constraints.zero();
                return true;
            }
            
            if(!(constraintIterator->get()->constraint->evaluateConstraint(time, state, control, constraintIterator->get()->constraintBuffer))) {
                return false;
            }

            if (constraintIterator->get()->constraintBuffer.size() > m_pimpl->maxConstraintSize) {
                std::ostringstream errorMsg;
                errorMsg << "Constraint named "<<m_pimpl->group.begin()->first<< "output a vector bigger than the specified size.";
                reportError("ConstraintsGroup", "evaluateConstraints", errorMsg.str().c_str());
                return false;
            }

            if (constraintIterator->get()->constraint->constraintSize() < m_pimpl->maxConstraintSize) {
                toEigen(constraints).segment(0,constraintIterator->get()->constraintBuffer.size()) = toEigen(constraintIterator->get()->constraintBuffer);
                toEigen(constraints).tail(m_pimpl->maxConstraintSize - constraintIterator->get()->constraintBuffer.size()).setZero(); //append 0 at the end to equate the maxConstraintSize.
            } else {
                constraints = constraintIterator->get()->constraintBuffer;
            }

            return true;
        }